

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O1

ssize_t dlep_session_process_signal(dlep_session *session,void *ptr,size_t length,_Bool is_udp)

{
  size_t *psVar1;
  avl_node **ppaVar2;
  oonf_log_source oVar3;
  dlep_signals dVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  dlep_parser_value *pdVar11;
  avl_tree *paVar12;
  avl_tree *paVar13;
  list_entity *plVar14;
  code *pcVar15;
  size_t sVar16;
  _func_int_void_ptr_void_ptr *p_Var17;
  undefined8 uVar18;
  int32_t iVar19;
  size_t sVar20;
  ushort uVar21;
  uint8_t *puVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  char *pcVar26;
  ulong uVar27;
  ulong uVar28;
  size_t __size;
  _func_int_void_ptr_void_ptr *p_Var29;
  ulong uVar30;
  _func_int_void_ptr_void_ptr *p_Var31;
  ushort local_b2;
  ulong local_b0;
  size_t local_a8;
  dlep_session_parser *local_a0;
  ulong local_98;
  uint8_t *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  netaddr_str nbuf;
  
  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;
  if (length < 4) {
    oVar3 = session->log_source;
    if (((&log_global_mask)[oVar3] & 1) != 0) {
      uVar9 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
      oonf_log(1,(ulong)oVar3,"src/generic/dlep/dlep_session.c",0x186,0,0,
               "Not enough data to process signal from %s (%zu bytes)",uVar9,length);
      return 0;
    }
  }
  else {
    uVar21 = *(ushort *)((long)ptr + 2);
    uVar7 = *ptr << 8 | *ptr >> 8;
    uVar5 = uVar7 + 0x10000;
    if (!is_udp) {
      uVar5 = (uint)uVar7;
    }
    uVar25 = (ulong)uVar5;
    uVar27 = (ulong)(ushort)(uVar21 << 8 | uVar21 >> 8);
    uVar30 = uVar27 + 4;
    uVar28 = (ulong)session->log_source;
    if (uVar30 <= length) {
      local_b0 = uVar25;
      if (((&log_global_mask)[uVar28] & 1) != 0) {
        uVar9 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
        oonf_log(1,uVar28,"src/generic/dlep/dlep_session.c",0x1a3,ptr,uVar30,
                 "Process signal %d from %s (%zu bytes)",local_b0,uVar9,length);
      }
      dVar4 = session->restrict_signal;
      if ((dVar4 != DLEP_ALL_SIGNALS) && (dVar4 != (dlep_signals)local_b0)) {
        if (((&log_global_mask)[session->log_source] & 1) == 0) {
          return -1;
        }
        oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x1a9,0,0,
                 "Signal should have been %d, drop session",dVar4);
        return -1;
      }
      puVar22 = (uint8_t *)((long)ptr + 4);
      (session->parser).tlv_ptr = puVar22;
      for (plVar14 = (session->parser).allowed_tlvs.list_head.next;
          plVar14->prev != (session->parser).allowed_tlvs.list_head.prev; plVar14 = plVar14->next) {
        *(undefined8 *)((long)&plVar14[-2].prev + 4) = 0xffffffffffffffff;
      }
      local_a0 = &session->parser;
      bVar6 = true;
      local_98 = uVar30;
      local_90 = puVar22;
      if (uVar21 == 0) {
        iVar8 = 0;
      }
      else {
        __size = 0x400;
        sVar20 = 0;
        uVar30 = 0;
        local_78 = uVar27;
        do {
          if (local_78 - uVar30 < 4) {
            iVar8 = -2;
LAB_00109841:
            bVar6 = false;
            goto LAB_00109844;
          }
          uVar21 = *(ushort *)(puVar22 + uVar30) << 8 | *(ushort *)(puVar22 + uVar30) >> 8;
          uVar7 = *(ushort *)(puVar22 + uVar30 + 2) << 8 | *(ushort *)(puVar22 + uVar30 + 2) >> 8;
          uVar25 = uVar30 + uVar7 + 4;
          if (local_78 < uVar25) {
            iVar8 = -3;
            if (((&log_global_mask)[session->log_source] & 4) == 0) goto LAB_00109841;
            bVar6 = false;
            oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x381,0,0,
                     "TLV %u incomplete: %zu > %zu",uVar21,uVar25,local_78);
            iVar8 = -3;
            goto LAB_00109844;
          }
          local_b2 = uVar21;
          local_a8 = sVar20;
          local_88 = (ulong)uVar7;
          local_80 = uVar25;
          lVar10 = avl_find(local_a0,&local_b2);
          if (lVar10 == 0) {
            iVar8 = -4;
            if (((&log_global_mask)[session->log_source] & 2) == 0) goto LAB_00109841;
            bVar6 = false;
            oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x388,0,0,
                     "Unsupported TLV %u",uVar21);
            iVar8 = -4;
            goto LAB_00109844;
          }
          if ((*(ushort *)(lVar10 + -10) < uVar7) || (uVar7 < *(ushort *)(lVar10 + -0xc))) {
            iVar8 = -5;
            if (((&log_global_mask)[session->log_source] & 4) == 0) goto LAB_00109841;
            bVar6 = false;
            oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x391,0,0,
                     "TLV %u has wrong size, %d is not between %u and %u",uVar21,local_88,
                     *(undefined2 *)(lVar10 + -0xc),*(ushort *)(lVar10 + -10));
            iVar8 = -5;
            goto LAB_00109844;
          }
          if (local_a8 == (session->parser).value_max_count) {
            pdVar11 = (dlep_parser_value *)realloc((session->parser).values,__size);
            if (pdVar11 == (dlep_parser_value *)0x0) {
              iVar8 = -8;
              bVar6 = false;
              goto LAB_00109844;
            }
            psVar1 = &(session->parser).value_max_count;
            *psVar1 = *psVar1 + 0x80;
            (session->parser).values = pdVar11;
            puVar22 = local_90;
          }
          if (((&log_global_mask)[session->log_source] & 1) != 0) {
            oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x3a0,
                     puVar22 + uVar30 + 4,local_88,"Received TLV %u",uVar21);
          }
          pdVar11 = (session->parser).values;
          *(undefined4 *)((long)&pdVar11[-0x80].tlv_next + __size) = 0xffffffff;
          *(short *)((long)pdVar11 + (__size - 0x3fc)) = (short)(uVar30 + 4);
          *(ushort *)((long)pdVar11 + (__size - 0x3fa)) = uVar7;
          iVar19 = (int32_t)local_a8;
          if ((long)*(int *)(lVar10 + -0x10) == -1) {
            *(int32_t *)(lVar10 + -0x14) = iVar19;
          }
          else {
            (session->parser).values[*(int *)(lVar10 + -0x10)].tlv_next = iVar19;
          }
          *(int32_t *)(lVar10 + -0x10) = iVar19;
          sVar20 = local_a8 + 1;
          __size = __size + 8;
          uVar30 = local_80;
        } while (local_80 < local_78);
        iVar8 = 0;
        bVar6 = true;
      }
LAB_00109844:
      if (!bVar6) {
        if (((&log_global_mask)[session->log_source] & 1) != 0) {
          oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x329,0,0,
                   "parse_tlvstream result: %d",iVar8);
        }
LAB_00109d8c:
        uVar30 = local_98;
        if (iVar8 == -1) {
          return -1;
        }
        if (iVar8 == 0) {
          if (session->next_restrict_signal == DLEP_KEEP_RESTRICTION) {
            return local_98;
          }
          session->restrict_signal = session->next_restrict_signal;
          return local_98;
        }
        if (((&log_global_mask)[session->log_source] & 4) != 0) {
          oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x1b5,0,0,
                   "Parser error: %d",iVar8);
        }
        if ((uint)(session->restrict_signal + ~DLEP_IS_UDP_SIGNAL) < 2) {
          return uVar30;
        }
        dlep_session_generate_signal_status
                  (session,5,(oonf_layer2_neigh_key *)0x0,DLEP_STATUS_INVALID_DATA,
                   "Incoming signal could not be parsed");
        session->restrict_signal = DLEP_SESSION_TERMINATION_ACK;
        session->next_restrict_signal = DLEP_SESSION_TERMINATION_ACK;
        return uVar30;
      }
      paVar12 = dlep_extension_get_tree();
LAB_0010985a:
      paVar12 = (avl_tree *)(paVar12->list_head).next;
      plVar14 = (paVar12->list_head).prev;
      paVar13 = dlep_extension_get_tree();
      if (plVar14 != (paVar13->list_head).prev) {
        sVar20 = (session->parser).extension_count;
        iVar8 = 0;
        iVar23 = (int)local_b0;
        if (sVar20 != 0) {
          ppaVar2 = &paVar12[-4].root;
          sVar16 = 0;
          do {
            if ((session->parser).extensions[sVar16] == (dlep_extension *)ppaVar2) {
              plVar14 = paVar12[-3].list_head.next;
              if (plVar14 == (list_entity *)0x0) goto LAB_001098ca;
              p_Var29 = paVar12[-4].comp;
              goto LAB_001098bc;
            }
            sVar16 = sVar16 + 1;
          } while (sVar20 != sVar16);
        }
        goto LAB_00109c1d;
      }
      iVar8 = 0;
      goto LAB_00109d8c;
    }
    if (((&log_global_mask)[uVar28] & 1) != 0) {
      uVar9 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
      oonf_log(1,uVar28,"src/generic/dlep/dlep_session.c",0x19d,0,0,
               "Not enough data to process signal %u (length %u) from %s (%zu bytes)",uVar25,uVar27,
               uVar9,length);
      return 0;
    }
  }
  return 0;
  while( true ) {
    p_Var29 = p_Var29 + 0x58;
    plVar14 = (list_entity *)((long)&plVar14[-1].prev + 7);
    if (plVar14 == (list_entity *)0x0) break;
LAB_001098bc:
    if (*(int *)p_Var29 == iVar23) goto LAB_001098cd;
  }
LAB_001098ca:
  p_Var29 = (_func_int_void_ptr_void_ptr *)0x0;
LAB_001098cd:
  iVar8 = 0;
  bVar6 = true;
  if ((p_Var29 != (_func_int_void_ptr_void_ptr *)0x0) && (*(long *)(p_Var29 + 0x20) != 0)) {
    uVar30 = 0;
    do {
      local_b2 = *(ushort *)(*(long *)(p_Var29 + 0x18) + uVar30 * 2);
      lVar10 = avl_find(local_a0,&local_b2);
      if (lVar10 == 0) {
        iVar8 = -9;
        if (((&log_global_mask)[session->log_source] & 4) != 0) {
          oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x3dc,0,0,
                   "Could not find tlv data for mandatory TLV %u in extension %d",
                   *(undefined2 *)(*(long *)(p_Var29 + 0x18) + uVar30 * 2),*(undefined4 *)ppaVar2);
          iVar8 = -9;
        }
LAB_001099fd:
        bVar6 = false;
        iVar23 = (int)local_b0;
        goto LAB_00109a02;
      }
      if (*(int *)(lVar10 + -0x14) == -1) {
        iVar8 = -6;
        if (((&log_global_mask)[session->log_source] & 4) != 0) {
          oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x3e4,0,0,
                   "Missing mandatory TLV %u in extension %d",
                   *(undefined2 *)(*(long *)(p_Var29 + 0x18) + uVar30 * 2),*(undefined4 *)ppaVar2);
          iVar8 = -6;
        }
        goto LAB_001099fd;
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 < *(ulong *)(p_Var29 + 0x20));
    iVar23 = (int)local_b0;
    iVar8 = 0;
  }
LAB_00109a02:
  if (bVar6) {
    plVar14 = paVar12[-3].list_head.next;
    if (plVar14 == (list_entity *)0x0) {
      p_Var29 = (_func_int_void_ptr_void_ptr *)0x0;
    }
    else {
      p_Var31 = paVar12[-4].comp;
      p_Var17 = p_Var31 + (long)plVar14 * 0x58 + -0x58;
      do {
        p_Var29 = p_Var31;
        if (*(int *)p_Var31 == iVar23) break;
        p_Var31 = p_Var31 + 0x58;
        plVar14 = (list_entity *)((long)&plVar14[-1].prev + 7);
        p_Var29 = p_Var17;
      } while (plVar14 != (list_entity *)0x0);
    }
    iVar8 = 0;
    bVar6 = true;
    if ((p_Var29 != (_func_int_void_ptr_void_ptr *)0x0) && (*(long *)(p_Var29 + 0x10) != 0)) {
      uVar30 = 0;
      do {
        lVar10 = avl_find(local_a0,uVar30 * 2 + *(long *)(p_Var29 + 8));
        if ((lVar10 != 0) && (*(int *)(lVar10 + -0x14) != *(int *)(lVar10 + -0x10))) {
          if (*(long *)(p_Var29 + 0x30) == 0) {
LAB_00109ae5:
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x41a,0,0,
                       "Duplicate not allowed for TLV %u in extension %d",*(short *)(lVar10 + -0x18)
                       ,*(undefined4 *)ppaVar2);
            }
            bVar6 = false;
            iVar8 = -7;
            iVar23 = (int)local_b0;
            goto LAB_00109b54;
          }
          lVar24 = 0;
          while (*(short *)(*(long *)(p_Var29 + 0x28) + lVar24 * 2) != *(short *)(lVar10 + -0x18)) {
            lVar24 = lVar24 + 1;
            if (*(long *)(p_Var29 + 0x30) == lVar24) goto LAB_00109ae5;
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 < *(ulong *)(p_Var29 + 0x10));
      iVar23 = (int)local_b0;
      iVar8 = 0;
    }
LAB_00109b54:
    if (bVar6) {
      plVar14 = paVar12[-3].list_head.next;
      bVar6 = true;
      if (plVar14 != (list_entity *)0x0) {
        pcVar15 = paVar12[-4].comp + 0x40;
        do {
          if (*(int *)(pcVar15 + -0x40) == iVar23) {
            if (session->radio == true) {
              if (*(code **)(pcVar15 + -8) == (code *)0x0) break;
              iVar8 = (**(code **)(pcVar15 + -8))(ppaVar2,session);
              iVar23 = 0;
              if (iVar8 == 0) goto LAB_00109b85;
              uVar30 = (ulong)session->log_source;
              if (((&log_global_mask)[uVar30] & 1) == 0) {
LAB_00109ceb:
                iVar23 = -1;
                bVar6 = false;
                goto LAB_00109b85;
              }
              uVar18 = 0x433;
              uVar9._0_4_ = paVar12[-4].count;
              uVar9._4_1_ = paVar12[-4].allow_dups;
              uVar9._5_3_ = *(undefined3 *)&paVar12[-4].field_0x1d;
              pcVar26 = "Error in radio signal processing of extension \'%s\'";
            }
            else {
              if (*(code **)pcVar15 == (code *)0x0) break;
              iVar8 = (**(code **)pcVar15)(ppaVar2,session);
              iVar23 = 0;
              if (iVar8 == 0) goto LAB_00109b85;
              uVar30 = (ulong)session->log_source;
              if (((&log_global_mask)[uVar30] & 1) == 0) goto LAB_00109ceb;
              uVar18 = 0x439;
              uVar9._0_4_ = paVar12[-4].count;
              uVar9._4_1_ = paVar12[-4].allow_dups;
              uVar9._5_3_ = *(undefined3 *)&paVar12[-4].field_0x1d;
              pcVar26 = "Error in router signal processing of extension \'%s\'";
            }
            bVar6 = false;
            iVar23 = -1;
            oonf_log(1,uVar30,"src/generic/dlep/dlep_session.c",uVar18,0,0,pcVar26,uVar9);
            goto LAB_00109b85;
          }
          pcVar15 = pcVar15 + 0x58;
          plVar14 = (list_entity *)((long)&plVar14[-1].prev + 7);
        } while (plVar14 != (list_entity *)0x0);
      }
      iVar23 = 0;
LAB_00109b85:
      iVar8 = 0;
      if ((!bVar6) && (iVar8 = iVar23, ((&log_global_mask)[session->log_source] & 1) != 0)) {
        oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x313,0,0,
                 "extension processing failed: %d",iVar23);
      }
      goto LAB_00109c1d;
    }
    uVar30 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar30] & 1) == 0) goto LAB_00109c1d;
    uVar9 = 0x30e;
    pcVar26 = "check_duplicate result: %d";
  }
  else {
    uVar30 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar30] & 1) == 0) goto LAB_00109c1d;
    uVar9 = 0x30a;
    pcVar26 = "check_mandatory result: %d";
  }
  oonf_log(1,uVar30,"src/generic/dlep/dlep_session.c",uVar9,0,0,pcVar26,iVar8);
LAB_00109c1d:
  if (iVar8 != 0) goto LAB_00109d8c;
  goto LAB_0010985a;
}

Assistant:

ssize_t
dlep_session_process_signal(struct dlep_session *session, const void *ptr, size_t length, bool is_udp) {
  enum dlep_parser_error result;
  uint16_t original_signal_type;
  int32_t signal_type;
  uint16_t signal_length;
  const uint8_t *buffer;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;

  if (length < 4) {
    /* not enough data for a signal type */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

    return 0;
  }

  buffer = ptr;

  /* copy data */
  memcpy(&original_signal_type, &buffer[0], sizeof(original_signal_type));
  memcpy(&signal_length, &buffer[2], sizeof(signal_length));
  signal_type = ntohs(original_signal_type);
  signal_length = ntohs(signal_length);

  if (is_udp) {
    signal_type += DLEP_IS_UDP_SIGNAL;
  }

  if (length < (size_t)signal_length + 4u) {
    /* not enough data for signal */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal %u (length %u) from %s"
      " (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      signal_type, signal_length, netaddr_socket_to_string(&nbuf, &session->remote_socket), length);
    return 0;
  }

  OONF_DEBUG_HEX(session->log_source, buffer, signal_length + 4,
    "Process signal %d from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)", signal_type,
    netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

  if (session->restrict_signal != DLEP_ALL_SIGNALS && session->restrict_signal != signal_type) {
    OONF_DEBUG(session->log_source,
      "Signal should have been %d,"
      " drop session",
      session->restrict_signal);
    /* we only accept a single type and we got the wrong one */
    return -1;
  }

  result = _process_tlvs(session, signal_type, signal_length, &buffer[4]);

  if (result == DLEP_NEW_PARSER_TERMINDATED) {
    /* session is now invalid, end parser */
    return result;
  }
  if (result != DLEP_NEW_PARSER_OKAY) {
    OONF_WARN(session->log_source, "Parser error: %d", result);
    _send_terminate(session, DLEP_STATUS_INVALID_DATA, "Incoming signal could not be parsed");
  }
  else if (session->next_restrict_signal != DLEP_KEEP_RESTRICTION) {
    session->restrict_signal = session->next_restrict_signal;
  }

  /* skip forward */
  return signal_length + 4;
}